

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eternal.hpp
# Opt level: O1

element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_> *
mapbox::eternal::impl::
bound<mapbox::eternal::impl::less,mapbox::eternal::impl::element_hash<mapbox::eternal::string,unsigned_int,std::hash<mapbox::eternal::string>>const*,mapbox::eternal::impl::compare_key_hash<mapbox::eternal::string,std::hash<mapbox::eternal::string>>>
          (element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>
           *left,element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>
                 *right,
          compare_key_hash<mapbox::eternal::string,_std::hash<mapbox::eternal::string>_> *key)

{
  element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_> *peVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((long)right - (long)left != 0) {
    uVar4 = ((long)right - (long)left >> 3) * -0x5555555555555555;
    do {
      uVar3 = uVar4 >> 1;
      peVar1 = left + uVar3;
      bVar2 = true;
      if (key->hash <= peVar1->hash) {
        if (key->hash < peVar1->hash) {
          bVar2 = false;
        }
        else {
          bVar2 = str_less((peVar1->super_element<mapbox::eternal::string,_unsigned_int>).pair.first
                           .data_,(key->super_compare_key<mapbox::eternal::string>).key.data_);
        }
      }
      if (bVar2 != false) {
        left = peVar1 + 1;
        uVar3 = ~uVar3 + uVar4;
      }
      uVar4 = uVar3;
    } while (uVar3 != 0);
  }
  return left;
}

Assistant:

MAPBOX_ETERNAL_CONSTEXPR auto bound(Iterator left, Iterator right, const Key& key) noexcept {
    std::size_t count = std::size_t(right - left);
    while (count > 0) {
        const std::size_t step = count / 2;
        right = left + step;
        if (Compare()(*right, key)) {
            left = ++right;
            count -= step + 1;
        } else {
            count = step;
        }
    }
    return left;
}